

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  __PHYSFS_DIRHANDLE__ *h;
  ulong *puVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong *puVar7;
  ErrState *pEVar8;
  ulong *puVar9;
  PHYSFS_ErrorCode errcode;
  bool bVar10;
  ulong uStack_48;
  PHYSFS_Stat *local_40;
  ulong *local_38;
  char *arcfname;
  
  puVar9 = &uStack_48;
  if ((_fname == (char *)0x0) || (stat == (PHYSFS_Stat *)0x0)) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    sVar6 = strlen(_fname);
    if (sVar6 + 1 < 0x100) {
      puVar7 = (ulong *)((long)&uStack_48 - (sVar6 + 0x18 & 0xfffffffffffffff0));
      puVar9 = puVar7;
    }
    else {
      puVar7 = (ulong *)0x0;
      puVar9 = &uStack_48;
    }
    bVar10 = puVar7 == (ulong *)0x0;
    if (bVar10) {
      puVar9[-1] = 0x1091ce;
      puVar7 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar6 + 9);
    }
    if (puVar7 == (ulong *)0x0) {
      puVar7 = (ulong *)0x0;
    }
    else {
      *puVar7 = (ulong)bVar10;
      puVar7 = puVar7 + 1;
    }
    if (puVar7 != (ulong *)0x0) {
      *(undefined4 *)&stat->createtime = 0xffffffff;
      *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
      *(undefined4 *)&stat->accesstime = 0xffffffff;
      *(undefined4 *)((long)&stat->accesstime + 4) = 0xffffffff;
      *(undefined4 *)&stat->filesize = 0xffffffff;
      *(undefined4 *)((long)&stat->filesize + 4) = 0xffffffff;
      *(undefined4 *)&stat->modtime = 0xffffffff;
      *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
      stat->filetype = PHYSFS_FILETYPE_OTHER;
      stat->readonly = 1;
      puVar9[-1] = 0x109217;
      iVar4 = sanitizePlatformIndependentPath(_fname,(char *)puVar7);
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else if ((char)*puVar7 == '\0') {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->readonly = (uint)(writeDir == (DirHandle *)0x0);
        iVar4 = 1;
      }
      else {
        puVar9[-1] = 0x109235;
        __PHYSFS_platformGrabMutex(stateLock);
        iVar4 = 0;
        for (h = searchPath; h != (DirHandle *)0x0; h = h->next) {
          local_40 = stat;
          local_38 = puVar7;
          puVar9[-1] = 0x10925b;
          iVar5 = partOfMountPoint(h,(char *)puVar7);
          if (iVar5 == 0) {
            puVar9[-1] = 0x109285;
            iVar5 = verifyPath(h,(char **)&local_38,0);
            puVar3 = local_38;
            bVar10 = true;
            if (iVar5 != 0) {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->stat;
              puVar9[-1] = 0x10929e;
              iVar5 = (*p_Var2)(pvVar1,(char *)puVar3,stat);
              if (iVar5 == 0) {
                puVar9[-1] = 0x1092c3;
                pEVar8 = findErrorForCurrentThread();
                if ((pEVar8 != (ErrState *)0x0) && (iVar4 = 0, pEVar8->code == PHYSFS_ERR_NOT_FOUND)
                   ) goto LAB_001092aa;
              }
              bVar10 = false;
              iVar4 = iVar5;
            }
          }
          else {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = 1;
            bVar10 = false;
            iVar4 = 1;
          }
LAB_001092aa:
          if (!bVar10) break;
          stat = local_40;
        }
        puVar9[-1] = 0x1092e9;
        __PHYSFS_platformReleaseMutex(stateLock);
      }
      if (puVar7[-1] == 0) {
        return iVar4;
      }
      puVar9[-1] = 0x109327;
      (*__PHYSFS_AllocatorHooks.Free)(puVar7 + -1);
      return iVar4;
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  *(undefined8 *)((long)puVar9 + -8) = 0x10919e;
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            __PHYSFS_platformGrabMutex(stateLock);
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
            __PHYSFS_platformReleaseMutex(stateLock);
        } /* else */
    } /* if */

    __PHYSFS_smallFree(fname);
    return retval;
}